

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPUDPv6Transmitter::DeleteDestination(RTPUDPv6Transmitter *this,RTPAddress *addr)

{
  int iVar1;
  ushort uVar2;
  RTPIPv6Destination dest;
  RTPIPv6Destination local_38;
  
  iVar1 = -0x72;
  if (((this->init == true) && (iVar1 = -0x71, this->created == true)) &&
     (iVar1 = -0x6c, addr->addresstype == IPv6Address)) {
    local_38.rtcpaddr.sin6_addr.__in6_u._0_8_ = *(undefined8 *)&addr->field_0xc;
    local_38.rtcpaddr.sin6_addr.__in6_u._8_8_ = *(undefined8 *)((long)&addr[1]._vptr_RTPAddress + 4)
    ;
    local_38.rtpaddr.sin6_flowinfo = 0;
    local_38.rtpaddr.sin6_scope_id = 0;
    local_38.rtcpaddr.sin6_scope_id = 0;
    uVar2 = (ushort)*(undefined4 *)&addr[1].field_0xc;
    local_38.rtpaddr.sin6_port = uVar2 << 8 | uVar2 >> 8;
    local_38.rtpaddr.sin6_family = 10;
    local_38.rtpaddr.sin6_addr.__in6_u.__u6_addr32[0] =
         (uint32_t)local_38.rtcpaddr.sin6_addr.__in6_u._0_8_;
    local_38.rtpaddr.sin6_addr.__in6_u.__u6_addr32[1] =
         (uint32_t)((ulong)local_38.rtcpaddr.sin6_addr.__in6_u._0_8_ >> 0x20);
    local_38.rtpaddr.sin6_addr.__in6_u.__u6_addr32[2] =
         (uint32_t)local_38.rtcpaddr.sin6_addr.__in6_u._8_8_;
    local_38.rtpaddr.sin6_addr.__in6_u.__u6_addr32[3] =
         (uint32_t)((ulong)local_38.rtcpaddr.sin6_addr.__in6_u._8_8_ >> 0x20);
    local_38.rtcpaddr.sin6_port = (uVar2 + 1) * 0x100 | (ushort)(uVar2 + 1) >> 8;
    local_38.rtcpaddr.sin6_family = 10;
    local_38.rtcpaddr.sin6_flowinfo = 0;
    iVar1 = RTPHashTable<const_jrtplib::RTPIPv6Destination,_jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,_8317>
            ::DeleteElement(&this->destinations,&local_38);
  }
  return iVar1;
}

Assistant:

int RTPUDPv6Transmitter::DeleteDestination(const RTPAddress &addr)
{
	if (!init)
		return ERR_RTP_UDPV6TRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTCREATED;
	}
	if (addr.GetAddressType() != RTPAddress::IPv6Address)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_INVALIDADDRESSTYPE;
	}
	
	RTPIPv6Address &address = (RTPIPv6Address &)addr;	
	RTPIPv6Destination dest(address.GetIP(),address.GetPort());
	int status = destinations.DeleteElement(dest);
	
	MAINMUTEX_UNLOCK
	return status;
}